

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse42::BVHNIntersector1<4,_16781328,_false,_embree::sse42::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  uint uVar7;
  uint uVar8;
  void *pvVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 (*pauVar15) [16];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 (*pauVar20) [16];
  void *pvVar21;
  ulong uVar22;
  uint uVar23;
  void *in_R8;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  float fVar28;
  float fVar29;
  float fVar48;
  float fVar49;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar50;
  float fVar51;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar52;
  float fVar53;
  float fVar54;
  vint4 bi;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  float fVar60;
  float fVar67;
  float fVar69;
  vfloat4 a0;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar68;
  float fVar70;
  float fVar71;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar77;
  vint4 ai_3;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar78;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  float fVar91;
  float fVar92;
  vint4 bi_1;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar93;
  float fVar94;
  float fVar96;
  float fVar97;
  vint4 ai;
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  float fVar99;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  vint4 ai_1;
  undefined1 auVar100 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar108 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1108 [16];
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  RayHit *local_10d0;
  Intersectors *local_10c8;
  RayQueryContext *local_10c0;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined1 local_1078 [16];
  undefined8 local_1068;
  undefined8 uStack_1060;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined8 local_1028;
  undefined8 uStack_1020;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_10c0 = context;
  local_10c8 = This;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_1048 = aVar6.x;
    local_1058 = aVar6.y;
    local_1038 = aVar6.z;
    auVar30 = dpps((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    auVar61 = rsqrtss(auVar30,auVar30);
    fVar28 = auVar61._0_4_;
    local_fb8[0] = fVar28 * 1.5 - fVar28 * fVar28 * auVar30._0_4_ * 0.5 * fVar28;
    auVar90._0_4_ = local_1048 * local_fb8[0];
    auVar90._4_4_ = local_1058 * local_fb8[0];
    auVar90._8_4_ = local_1038 * local_fb8[0];
    auVar90._12_4_ = aVar6.field_3.w * local_fb8[0];
    uVar24 = CONCAT44(auVar90._4_4_,auVar90._4_4_);
    auVar31._0_8_ = uVar24 ^ 0x8000000080000000;
    auVar31._8_4_ = -auVar90._12_4_;
    auVar31._12_4_ = -auVar90._12_4_;
    auVar79._0_12_ = ZEXT812(0);
    auVar79._12_4_ = 0;
    auVar31 = blendps(auVar31,auVar79,0xe);
    auVar30._4_4_ = auVar31._0_4_;
    auVar30._0_4_ = auVar90._8_4_;
    auVar30._8_4_ = auVar31._4_4_;
    auVar30._12_4_ = 0;
    auVar61._4_4_ = auVar31._0_4_;
    auVar61._0_4_ = auVar90._8_4_;
    auVar61._8_4_ = auVar31._4_4_;
    auVar61._12_4_ = 0;
    auVar100 = dpps(auVar61 << 0x20,auVar30 << 0x20,0x7f);
    uVar24 = CONCAT44(auVar90._12_4_,auVar90._8_4_);
    auVar85._0_8_ = uVar24 ^ 0x8000000080000000;
    auVar85._8_4_ = -auVar90._8_4_;
    auVar85._12_4_ = -auVar90._12_4_;
    auVar31 = insertps(auVar85,auVar90,0x2a);
    auVar61 = dpps(auVar31,auVar31,0x7f);
    iVar27 = -(uint)(auVar61._0_4_ < auVar100._0_4_);
    auVar100._4_4_ = iVar27;
    auVar100._0_4_ = iVar27;
    auVar100._8_4_ = iVar27;
    auVar100._12_4_ = iVar27;
    auVar30 = blendvps(auVar31,auVar30 << 0x20,auVar100);
    auVar61 = dpps(auVar30,auVar30,0x7f);
    auVar31 = rsqrtss(auVar61,auVar61);
    fVar28 = auVar31._0_4_;
    fVar28 = fVar28 * 1.5 - fVar28 * fVar28 * auVar61._0_4_ * 0.5 * fVar28;
    fVar29 = fVar28 * auVar30._0_4_;
    fVar48 = fVar28 * auVar30._4_4_;
    fVar49 = fVar28 * auVar30._8_4_;
    fVar28 = fVar28 * auVar30._12_4_;
    fVar84 = fVar48 * auVar90._0_4_ - auVar90._4_4_ * fVar29;
    fVar91 = fVar49 * auVar90._4_4_ - auVar90._8_4_ * fVar48;
    fVar92 = fVar29 * auVar90._8_4_ - auVar90._0_4_ * fVar49;
    auVar86._12_4_ = fVar28 * auVar90._12_4_ - auVar90._12_4_ * fVar28;
    auVar86._0_8_ = CONCAT44(fVar92,fVar91);
    auVar86._8_4_ = fVar84;
    auVar95._8_4_ = fVar84;
    auVar95._0_8_ = auVar86._0_8_;
    auVar95._12_4_ = auVar86._12_4_;
    auVar30 = dpps(auVar95,auVar86,0x7f);
    auVar61 = rsqrtss(auVar30,auVar30);
    fVar28 = auVar61._0_4_;
    fVar28 = fVar28 * 1.5 - fVar28 * fVar28 * auVar30._0_4_ * 0.5 * fVar28;
    local_f88._4_4_ = fVar28 * fVar84;
    local_f88._0_4_ = fVar49;
    local_f88._8_4_ = auVar90._8_4_ * local_fb8[0];
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar28 * fVar92;
    local_f98._0_4_ = fVar48;
    local_f98._8_4_ = auVar90._4_4_ * local_fb8[0];
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar28 * fVar91;
    local_fa8._0_4_ = fVar29;
    local_fa8._8_4_ = auVar90._0_4_ * local_fb8[0];
    local_fa8._12_4_ = 0;
    pauVar20 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar29 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar48 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar49 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar84 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    fVar28 = 0.0;
    if (0.0 <= fVar84) {
      fVar28 = fVar84;
    }
    fVar84 = (ray->super_RayK<1>).tfar;
    fVar91 = 0.0;
    if (0.0 <= fVar84) {
      fVar91 = fVar84;
    }
    auVar32._4_4_ = -(uint)(ABS(local_1058) < DAT_01f80d30._4_4_);
    auVar32._0_4_ = -(uint)(ABS(local_1048) < (float)DAT_01f80d30);
    auVar32._8_4_ = -(uint)(ABS(local_1038) < DAT_01f80d30._8_4_);
    auVar32._12_4_ = -(uint)(ABS(aVar6.field_3.w) < DAT_01f80d30._12_4_);
    auVar61 = blendvps((undefined1  [16])aVar6,_DAT_01f80d30,auVar32);
    auVar30 = rcpps(auVar32,auVar61);
    fVar84 = auVar30._0_4_;
    fVar101 = auVar30._4_4_;
    fVar103 = auVar30._8_4_;
    fVar84 = (1.0 - auVar61._0_4_ * fVar84) * fVar84 + fVar84;
    fVar101 = (1.0 - auVar61._4_4_ * fVar101) * fVar101 + fVar101;
    fVar103 = (1.0 - auVar61._8_4_ * fVar103) * fVar103 + fVar103;
    fStack_1044 = local_1048;
    fStack_1040 = local_1048;
    fStack_103c = local_1048;
    fStack_1054 = local_1058;
    fStack_1050 = local_1058;
    fStack_104c = local_1058;
    fStack_1034 = local_1038;
    fStack_1030 = local_1038;
    fStack_102c = local_1038;
    uVar24 = (ulong)(fVar84 < 0.0) * 0x10;
    uVar26 = (ulong)(fVar101 < 0.0) << 4 | 0x20;
    uVar25 = (ulong)(fVar103 < 0.0) << 4 | 0x40;
    auVar98._4_4_ = fVar28;
    auVar98._0_4_ = fVar28;
    auVar98._8_4_ = fVar28;
    auVar98._12_4_ = fVar28;
    local_10f8 = fVar49;
    fStack_10f4 = fVar49;
    fStack_10f0 = fVar49;
    fStack_10ec = fVar49;
    local_1078 = auVar98;
    local_1088 = fVar103;
    fStack_1084 = fVar103;
    fStack_1080 = fVar103;
    fStack_107c = fVar103;
    local_1098 = fVar29;
    fStack_1094 = fVar29;
    fStack_1090 = fVar29;
    fStack_108c = fVar29;
    local_10e8 = fVar48;
    fStack_10e4 = fVar48;
    fStack_10e0 = fVar48;
    fStack_10dc = fVar48;
    local_10a8 = fVar84;
    fStack_10a4 = fVar84;
    fStack_10a0 = fVar84;
    fStack_109c = fVar84;
    local_10b8 = fVar101;
    fStack_10b4 = fVar101;
    fStack_10b0 = fVar101;
    fStack_10ac = fVar101;
    local_10d0 = ray;
    fVar52 = fVar91;
    fVar53 = fVar91;
    fVar54 = fVar91;
    fVar28 = fVar84;
    fVar92 = fVar84;
    fVar106 = fVar84;
    fVar77 = fVar29;
    fVar50 = fVar29;
    fVar107 = fVar29;
    fVar78 = fVar49;
    fVar51 = fVar49;
    fVar59 = fVar49;
    fVar60 = fVar48;
    fVar67 = fVar48;
    fVar68 = fVar48;
    fVar69 = fVar103;
    fVar70 = fVar103;
    fVar71 = fVar103;
    fVar93 = fVar101;
    fVar94 = fVar101;
    fVar96 = fVar101;
    do {
      pauVar15 = pauVar20 + -1;
      pauVar20 = pauVar20 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar15 + 8) < *pfVar1 || *(float *)((long)*pauVar15 + 8) == *pfVar1) {
        pvVar21 = *(void **)*pauVar20;
        while (((ulong)pvVar21 & 8) == 0) {
          fVar5 = (ray->super_RayK<1>).dir.field_0.m128[3];
          uVar23 = (uint)pvVar21 & 7;
          uVar22 = (ulong)pvVar21 & 0xfffffffffffffff0;
          if (uVar23 == 3) {
            local_fe8 = *(float *)(uVar22 + 0x20);
            fStack_fe4 = *(float *)(uVar22 + 0x24);
            fStack_fe0 = *(float *)(uVar22 + 0x28);
            fStack_fdc = *(float *)(uVar22 + 0x2c);
            local_ff8 = *(float *)(uVar22 + 0x30);
            fStack_ff4 = *(float *)(uVar22 + 0x34);
            fStack_ff0 = *(float *)(uVar22 + 0x38);
            fStack_fec = *(float *)(uVar22 + 0x3c);
            local_1018 = *(float *)(uVar22 + 0x50);
            fStack_1014 = *(float *)(uVar22 + 0x54);
            fStack_1010 = *(float *)(uVar22 + 0x58);
            fStack_100c = *(float *)(uVar22 + 0x5c);
            local_1008 = *(float *)(uVar22 + 0x60);
            fStack_1004 = *(float *)(uVar22 + 100);
            fStack_1000 = *(float *)(uVar22 + 0x68);
            fStack_ffc = *(float *)(uVar22 + 0x6c);
            local_1028 = *(undefined8 *)(uVar22 + 0x70);
            uStack_1020 = *(undefined8 *)(uVar22 + 0x78);
            uVar18 = local_1028;
            uVar19 = uStack_1020;
            local_1068 = *(undefined8 *)(uVar22 + 0xa0);
            uStack_1060 = *(undefined8 *)(uVar22 + 0xa8);
            uVar16 = local_1068;
            uVar17 = uStack_1060;
            fVar101 = 1.0 - fVar5;
            fVar93 = fVar101 * 0.0;
            local_fd8 = *(float *)(uVar22 + 0xe0) * fVar5 + fVar93;
            fStack_fd4 = *(float *)(uVar22 + 0xe4) * fVar5 + fVar93;
            fStack_fd0 = *(float *)(uVar22 + 0xe8) * fVar5 + fVar93;
            fStack_fcc = *(float *)(uVar22 + 0xec) * fVar5 + fVar93;
            local_fc8 = *(float *)(uVar22 + 0xf0) * fVar5 + fVar93;
            fStack_fc4 = *(float *)(uVar22 + 0xf4) * fVar5 + fVar93;
            fStack_fc0 = *(float *)(uVar22 + 0xf8) * fVar5 + fVar93;
            fStack_fbc = *(float *)(uVar22 + 0xfc) * fVar5 + fVar93;
            auVar74._0_4_ =
                 local_1048 * local_fe8 +
                 local_1058 * local_1018 + local_1038 * *(float *)(uVar22 + 0x80);
            auVar74._4_4_ =
                 fStack_1044 * fStack_fe4 +
                 fStack_1054 * fStack_1014 + fStack_1034 * *(float *)(uVar22 + 0x84);
            auVar74._8_4_ =
                 fStack_1040 * fStack_fe0 +
                 fStack_1050 * fStack_1010 + fStack_1030 * *(float *)(uVar22 + 0x88);
            auVar74._12_4_ =
                 fStack_103c * fStack_fdc +
                 fStack_104c * fStack_100c + fStack_102c * *(float *)(uVar22 + 0x8c);
            auVar81._0_4_ =
                 local_1048 * local_ff8 +
                 local_1058 * local_1008 + local_1038 * *(float *)(uVar22 + 0x90);
            auVar81._4_4_ =
                 fStack_1044 * fStack_ff4 +
                 fStack_1054 * fStack_1004 + fStack_1034 * *(float *)(uVar22 + 0x94);
            auVar81._8_4_ =
                 fStack_1040 * fStack_ff0 +
                 fStack_1050 * fStack_1000 + fStack_1030 * *(float *)(uVar22 + 0x98);
            auVar81._12_4_ =
                 fStack_103c * fStack_fec +
                 fStack_104c * fStack_ffc + fStack_102c * *(float *)(uVar22 + 0x9c);
            fVar28 = (float)DAT_01f80d30;
            fVar29 = DAT_01f80d30._4_4_;
            fVar48 = DAT_01f80d30._8_4_;
            fVar49 = DAT_01f80d30._12_4_;
            auVar35._4_4_ = -(uint)(ABS(auVar74._4_4_) < fVar29);
            auVar35._0_4_ = -(uint)(ABS(auVar74._0_4_) < fVar28);
            auVar35._8_4_ = -(uint)(ABS(auVar74._8_4_) < fVar48);
            auVar35._12_4_ = -(uint)(ABS(auVar74._12_4_) < fVar49);
            auVar31 = blendvps(auVar74,_DAT_01f80d30,auVar35);
            auVar36._4_4_ = -(uint)(ABS(auVar81._4_4_) < fVar29);
            auVar36._0_4_ = -(uint)(ABS(auVar81._0_4_) < fVar28);
            auVar36._8_4_ = -(uint)(ABS(auVar81._8_4_) < fVar48);
            auVar36._12_4_ = -(uint)(ABS(auVar81._12_4_) < fVar49);
            auVar100 = blendvps(auVar81,_DAT_01f80d30,auVar36);
            local_1068._4_4_ = (float)((ulong)local_1068 >> 0x20);
            uStack_1060._4_4_ = (float)((ulong)uStack_1060 >> 0x20);
            local_1028._4_4_ = (float)((ulong)local_1028 >> 0x20);
            uStack_1020._4_4_ = (float)((ulong)uStack_1020 >> 0x20);
            auVar63._0_4_ =
                 local_1048 * *(float *)(uVar22 + 0x40) +
                 local_1058 * (float)local_1028 + local_1038 * (float)local_1068;
            auVar63._4_4_ =
                 fStack_1044 * *(float *)(uVar22 + 0x44) +
                 fStack_1054 * local_1028._4_4_ + fStack_1034 * local_1068._4_4_;
            auVar63._8_4_ =
                 fStack_1040 * *(float *)(uVar22 + 0x48) +
                 fStack_1050 * (float)uStack_1020 + fStack_1030 * (float)uStack_1060;
            auVar63._12_4_ =
                 fStack_103c * *(float *)(uVar22 + 0x4c) +
                 fStack_104c * uStack_1020._4_4_ + fStack_102c * uStack_1060._4_4_;
            auVar37._4_4_ = -(uint)(ABS(auVar63._4_4_) < fVar29);
            auVar37._0_4_ = -(uint)(ABS(auVar63._0_4_) < fVar28);
            auVar37._8_4_ = -(uint)(ABS(auVar63._8_4_) < fVar48);
            auVar37._12_4_ = -(uint)(ABS(auVar63._12_4_) < fVar49);
            auVar61 = blendvps(auVar63,_DAT_01f80d30,auVar37);
            auVar30 = rcpps(auVar37,auVar31);
            fVar28 = auVar30._0_4_;
            fVar49 = auVar30._4_4_;
            fVar106 = auVar30._8_4_;
            fVar107 = auVar30._12_4_;
            fVar28 = (1.0 - auVar31._0_4_ * fVar28) * fVar28 + fVar28;
            fVar49 = (1.0 - auVar31._4_4_ * fVar49) * fVar49 + fVar49;
            fVar106 = (1.0 - auVar31._8_4_ * fVar106) * fVar106 + fVar106;
            fVar107 = (1.0 - auVar31._12_4_ * fVar107) * fVar107 + fVar107;
            auVar30 = rcpps(auVar30,auVar100);
            fVar29 = auVar30._0_4_;
            auVar82._0_4_ = auVar100._0_4_ * fVar29;
            fVar84 = auVar30._4_4_;
            auVar82._4_4_ = auVar100._4_4_ * fVar84;
            fVar77 = auVar30._8_4_;
            auVar82._8_4_ = auVar100._8_4_ * fVar77;
            fVar78 = auVar30._12_4_;
            auVar82._12_4_ = auVar100._12_4_ * fVar78;
            fVar29 = (1.0 - auVar82._0_4_) * fVar29 + fVar29;
            fVar84 = (1.0 - auVar82._4_4_) * fVar84 + fVar84;
            fVar77 = (1.0 - auVar82._8_4_) * fVar77 + fVar77;
            fVar78 = (1.0 - auVar82._12_4_) * fVar78 + fVar78;
            auVar30 = rcpps(auVar82,auVar61);
            fVar48 = auVar30._0_4_;
            fVar92 = auVar30._4_4_;
            fVar50 = auVar30._8_4_;
            fVar51 = auVar30._12_4_;
            fVar48 = (1.0 - auVar61._0_4_ * fVar48) * fVar48 + fVar48;
            fVar92 = (1.0 - auVar61._4_4_ * fVar92) * fVar92 + fVar92;
            fVar50 = (1.0 - auVar61._8_4_ * fVar50) * fVar50 + fVar50;
            fVar51 = (1.0 - auVar61._12_4_ * fVar51) * fVar51 + fVar51;
            fVar59 = local_fe8 * local_1098 +
                     local_1018 * local_10e8 +
                     *(float *)(uVar22 + 0x80) * local_10f8 + *(float *)(uVar22 + 0xb0);
            fVar67 = fStack_fe4 * fStack_1094 +
                     fStack_1014 * fStack_10e4 +
                     *(float *)(uVar22 + 0x84) * fStack_10f4 + *(float *)(uVar22 + 0xb4);
            fVar103 = fStack_fe0 * fStack_1090 +
                      fStack_1010 * fStack_10e0 +
                      *(float *)(uVar22 + 0x88) * fStack_10f0 + *(float *)(uVar22 + 0xb8);
            fVar70 = fStack_fdc * fStack_108c +
                     fStack_100c * fStack_10dc +
                     *(float *)(uVar22 + 0x8c) * fStack_10ec + *(float *)(uVar22 + 0xbc);
            fVar60 = local_ff8 * local_1098 +
                     local_1008 * local_10e8 +
                     *(float *)(uVar22 + 0x90) * local_10f8 + *(float *)(uVar22 + 0xc0);
            fVar68 = fStack_ff4 * fStack_1094 +
                     fStack_1004 * fStack_10e4 +
                     *(float *)(uVar22 + 0x94) * fStack_10f4 + *(float *)(uVar22 + 0xc4);
            fVar69 = fStack_ff0 * fStack_1090 +
                     fStack_1000 * fStack_10e0 +
                     *(float *)(uVar22 + 0x98) * fStack_10f0 + *(float *)(uVar22 + 200);
            fVar71 = fStack_fec * fStack_108c +
                     fStack_ffc * fStack_10dc +
                     *(float *)(uVar22 + 0x9c) * fStack_10ec + *(float *)(uVar22 + 0xcc);
            fVar109 = *(float *)(uVar22 + 0x40) * local_1098 +
                      (float)local_1028 * local_10e8 +
                      (float)local_1068 * local_10f8 + *(float *)(uVar22 + 0xd0);
            fVar110 = *(float *)(uVar22 + 0x44) * fStack_1094 +
                      local_1028._4_4_ * fStack_10e4 +
                      local_1068._4_4_ * fStack_10f4 + *(float *)(uVar22 + 0xd4);
            fVar111 = *(float *)(uVar22 + 0x48) * fStack_1090 +
                      (float)uStack_1020 * fStack_10e0 +
                      (float)uStack_1060 * fStack_10f0 + *(float *)(uVar22 + 0xd8);
            fVar112 = *(float *)(uVar22 + 0x4c) * fStack_108c +
                      uStack_1020._4_4_ * fStack_10dc +
                      uStack_1060._4_4_ * fStack_10ec + *(float *)(uVar22 + 0xdc);
            fVar99 = (local_fd8 - fVar59) * fVar28;
            fVar102 = (fStack_fd4 - fVar67) * fVar49;
            fVar104 = (fStack_fd0 - fVar103) * fVar106;
            fVar105 = (fStack_fcc - fVar70) * fVar107;
            fVar28 = ((*(float *)(uVar22 + 0x110) * fVar5 + fVar101) - fVar59) * fVar28;
            fVar49 = ((*(float *)(uVar22 + 0x114) * fVar5 + fVar101) - fVar67) * fVar49;
            fVar106 = ((*(float *)(uVar22 + 0x118) * fVar5 + fVar101) - fVar103) * fVar106;
            fVar107 = ((*(float *)(uVar22 + 0x11c) * fVar5 + fVar101) - fVar70) * fVar107;
            fVar59 = (local_fc8 - fVar60) * fVar29;
            fVar67 = (fStack_fc4 - fVar68) * fVar84;
            fVar103 = (fStack_fc0 - fVar69) * fVar77;
            fVar70 = (fStack_fbc - fVar71) * fVar78;
            fVar94 = ((fVar93 + *(float *)(uVar22 + 0x100) * fVar5) - fVar109) * fVar48;
            fVar96 = ((fVar93 + *(float *)(uVar22 + 0x104) * fVar5) - fVar110) * fVar92;
            fVar97 = ((fVar93 + *(float *)(uVar22 + 0x108) * fVar5) - fVar111) * fVar50;
            fVar93 = ((fVar93 + *(float *)(uVar22 + 0x10c) * fVar5) - fVar112) * fVar51;
            fVar29 = ((*(float *)(uVar22 + 0x120) * fVar5 + fVar101) - fVar60) * fVar29;
            fVar84 = ((*(float *)(uVar22 + 0x124) * fVar5 + fVar101) - fVar68) * fVar84;
            fVar77 = ((*(float *)(uVar22 + 0x128) * fVar5 + fVar101) - fVar69) * fVar77;
            fVar78 = ((*(float *)(uVar22 + 300) * fVar5 + fVar101) - fVar71) * fVar78;
            fVar48 = ((fVar5 * *(float *)(uVar22 + 0x130) + fVar101) - fVar109) * fVar48;
            fVar92 = ((fVar5 * *(float *)(uVar22 + 0x134) + fVar101) - fVar110) * fVar92;
            fVar50 = ((fVar5 * *(float *)(uVar22 + 0x138) + fVar101) - fVar111) * fVar50;
            fVar51 = ((fVar5 * *(float *)(uVar22 + 0x13c) + fVar101) - fVar112) * fVar51;
            auVar38._0_4_ =
                 (uint)((int)fVar29 < (int)fVar59) * (int)fVar29 |
                 (uint)((int)fVar29 >= (int)fVar59) * (int)fVar59;
            auVar38._4_4_ =
                 (uint)((int)fVar84 < (int)fVar67) * (int)fVar84 |
                 (uint)((int)fVar84 >= (int)fVar67) * (int)fVar67;
            auVar38._8_4_ =
                 (uint)((int)fVar77 < (int)fVar103) * (int)fVar77 |
                 (uint)((int)fVar77 >= (int)fVar103) * (int)fVar103;
            auVar38._12_4_ =
                 (uint)((int)fVar78 < (int)fVar70) * (int)fVar78 |
                 (uint)((int)fVar78 >= (int)fVar70) * (int)fVar70;
            auVar64._0_4_ =
                 (uint)((int)fVar48 < (int)fVar94) * (int)fVar48 |
                 (uint)((int)fVar48 >= (int)fVar94) * (int)fVar94;
            auVar64._4_4_ =
                 (uint)((int)fVar92 < (int)fVar96) * (int)fVar92 |
                 (uint)((int)fVar92 >= (int)fVar96) * (int)fVar96;
            auVar64._8_4_ =
                 (uint)((int)fVar50 < (int)fVar97) * (int)fVar50 |
                 (uint)((int)fVar50 >= (int)fVar97) * (int)fVar97;
            auVar64._12_4_ =
                 (uint)((int)fVar51 < (int)fVar93) * (int)fVar51 |
                 (uint)((int)fVar51 >= (int)fVar93) * (int)fVar93;
            auVar30 = maxps(auVar38,auVar64);
            auVar65._0_4_ =
                 (uint)((int)fVar28 < (int)fVar99) * (int)fVar28 |
                 (uint)((int)fVar28 >= (int)fVar99) * (int)fVar99;
            auVar65._4_4_ =
                 (uint)((int)fVar49 < (int)fVar102) * (int)fVar49 |
                 (uint)((int)fVar49 >= (int)fVar102) * (int)fVar102;
            auVar65._8_4_ =
                 (uint)((int)fVar106 < (int)fVar104) * (int)fVar106 |
                 (uint)((int)fVar106 >= (int)fVar104) * (int)fVar104;
            auVar65._12_4_ =
                 (uint)((int)fVar107 < (int)fVar105) * (int)fVar107 |
                 (uint)((int)fVar107 >= (int)fVar105) * (int)fVar105;
            auVar88._0_4_ =
                 (uint)((int)fVar28 < (int)fVar99) * (int)fVar99 |
                 (uint)((int)fVar28 >= (int)fVar99) * (int)fVar28;
            auVar88._4_4_ =
                 (uint)((int)fVar49 < (int)fVar102) * (int)fVar102 |
                 (uint)((int)fVar49 >= (int)fVar102) * (int)fVar49;
            auVar88._8_4_ =
                 (uint)((int)fVar106 < (int)fVar104) * (int)fVar104 |
                 (uint)((int)fVar106 >= (int)fVar104) * (int)fVar106;
            auVar88._12_4_ =
                 (uint)((int)fVar107 < (int)fVar105) * (int)fVar105 |
                 (uint)((int)fVar107 >= (int)fVar105) * (int)fVar107;
            auVar108._0_4_ =
                 (uint)((int)fVar29 < (int)fVar59) * (int)fVar59 |
                 (uint)((int)fVar29 >= (int)fVar59) * (int)fVar29;
            auVar108._4_4_ =
                 (uint)((int)fVar84 < (int)fVar67) * (int)fVar67 |
                 (uint)((int)fVar84 >= (int)fVar67) * (int)fVar84;
            auVar108._8_4_ =
                 (uint)((int)fVar77 < (int)fVar103) * (int)fVar103 |
                 (uint)((int)fVar77 >= (int)fVar103) * (int)fVar77;
            auVar108._12_4_ =
                 (uint)((int)fVar78 < (int)fVar70) * (int)fVar70 |
                 (uint)((int)fVar78 >= (int)fVar70) * (int)fVar78;
            auVar56._0_4_ =
                 (uint)((int)fVar48 < (int)fVar94) * (int)fVar94 |
                 (uint)((int)fVar48 >= (int)fVar94) * (int)fVar48;
            auVar56._4_4_ =
                 (uint)((int)fVar92 < (int)fVar96) * (int)fVar96 |
                 (uint)((int)fVar92 >= (int)fVar96) * (int)fVar92;
            auVar56._8_4_ =
                 (uint)((int)fVar50 < (int)fVar97) * (int)fVar97 |
                 (uint)((int)fVar50 >= (int)fVar97) * (int)fVar50;
            auVar56._12_4_ =
                 (uint)((int)fVar51 < (int)fVar93) * (int)fVar93 |
                 (uint)((int)fVar51 >= (int)fVar93) * (int)fVar51;
            auVar31 = minps(auVar108,auVar56);
            auVar61 = maxps(local_1078,auVar65);
            local_1108 = maxps(auVar61,auVar30);
            auVar39._4_4_ = fVar52;
            auVar39._0_4_ = fVar91;
            auVar39._8_4_ = fVar53;
            auVar39._12_4_ = fVar54;
            auVar30 = minps(auVar39,auVar88);
            auVar30 = minps(auVar30,auVar31);
            auVar57._4_4_ = -(uint)(local_1108._4_4_ <= auVar30._4_4_);
            auVar57._0_4_ = -(uint)(local_1108._0_4_ <= auVar30._0_4_);
            auVar57._8_4_ = -(uint)(local_1108._8_4_ <= auVar30._8_4_);
            auVar57._12_4_ = -(uint)(local_1108._12_4_ <= auVar30._12_4_);
            uVar23 = movmskps((int)in_R8,auVar57);
            auVar98 = local_1078;
            fVar84 = local_10a8;
            fVar28 = fStack_10a4;
            fVar92 = fStack_10a0;
            fVar106 = fStack_109c;
            fVar29 = local_1098;
            fVar77 = fStack_1094;
            fVar50 = fStack_1090;
            fVar107 = fStack_108c;
            fVar49 = local_10f8;
            fVar78 = fStack_10f4;
            fVar51 = fStack_10f0;
            fVar59 = fStack_10ec;
            fVar48 = local_10e8;
            fVar60 = fStack_10e4;
            fVar67 = fStack_10e0;
            fVar68 = fStack_10dc;
            fVar103 = local_1088;
            fVar69 = fStack_1084;
            fVar70 = fStack_1080;
            fVar71 = fStack_107c;
            fVar101 = local_10b8;
            fVar93 = fStack_10b4;
            fVar94 = fStack_10b0;
            fVar96 = fStack_10ac;
            local_1068 = uVar16;
            uStack_1060 = uVar17;
            local_1028 = uVar18;
            uStack_1020 = uVar19;
          }
          else {
            pfVar3 = (float *)(uVar22 + 0x80 + uVar24);
            pfVar1 = (float *)(uVar22 + 0x20 + uVar24);
            pfVar4 = (float *)(uVar22 + 0x80 + uVar26);
            pfVar2 = (float *)(uVar22 + 0x20 + uVar26);
            auVar33._0_4_ = ((*pfVar3 * fVar5 + *pfVar1) - fVar29) * fVar84;
            auVar33._4_4_ = ((pfVar3[1] * fVar5 + pfVar1[1]) - fVar77) * fVar28;
            auVar33._8_4_ = ((pfVar3[2] * fVar5 + pfVar1[2]) - fVar50) * fVar92;
            auVar33._12_4_ = ((pfVar3[3] * fVar5 + pfVar1[3]) - fVar107) * fVar106;
            auVar62._0_4_ = ((*pfVar4 * fVar5 + *pfVar2) - fVar48) * fVar101;
            auVar62._4_4_ = ((pfVar4[1] * fVar5 + pfVar2[1]) - fVar60) * fVar93;
            auVar62._8_4_ = ((pfVar4[2] * fVar5 + pfVar2[2]) - fVar67) * fVar94;
            auVar62._12_4_ = ((pfVar4[3] * fVar5 + pfVar2[3]) - fVar68) * fVar96;
            pfVar2 = (float *)(uVar22 + 0x80 + uVar25);
            pfVar1 = (float *)(uVar22 + 0x20 + uVar25);
            auVar72._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar49) * fVar103;
            auVar72._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar78) * fVar69;
            auVar72._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar51) * fVar70;
            auVar72._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar59) * fVar71;
            auVar30 = maxps(auVar62,auVar72);
            pfVar2 = (float *)(uVar22 + 0x80 + (uVar24 ^ 0x10));
            pfVar1 = (float *)(uVar22 + 0x20 + (uVar24 ^ 0x10));
            auVar80._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar29) * fVar84;
            auVar80._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar77) * fVar28;
            auVar80._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar50) * fVar92;
            auVar80._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar107) * fVar106;
            pfVar2 = (float *)(uVar22 + 0x80 + (uVar26 ^ 0x10));
            pfVar1 = (float *)(uVar22 + 0x20 + (uVar26 ^ 0x10));
            auVar87._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar48) * fVar101;
            auVar87._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar60) * fVar93;
            auVar87._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar67) * fVar94;
            auVar87._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar68) * fVar96;
            pfVar2 = (float *)(uVar22 + 0x80 + (uVar25 ^ 0x10));
            pfVar1 = (float *)(uVar22 + 0x20 + (uVar25 ^ 0x10));
            auVar73._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar49) * fVar103;
            auVar73._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar78) * fVar69;
            auVar73._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar51) * fVar70;
            auVar73._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar59) * fVar71;
            auVar31 = minps(auVar87,auVar73);
            auVar61 = maxps(auVar98,auVar33);
            local_1108 = maxps(auVar61,auVar30);
            auVar34._4_4_ = fVar52;
            auVar34._0_4_ = fVar91;
            auVar34._8_4_ = fVar53;
            auVar34._12_4_ = fVar54;
            auVar30 = minps(auVar34,auVar80);
            auVar30 = minps(auVar30,auVar31);
            if (uVar23 == 6) {
              bVar11 = (fVar5 < *(float *)(uVar22 + 0xf0) && *(float *)(uVar22 + 0xe0) <= fVar5) &&
                       local_1108._0_4_ <= auVar30._0_4_;
              bVar12 = (fVar5 < *(float *)(uVar22 + 0xf4) && *(float *)(uVar22 + 0xe4) <= fVar5) &&
                       local_1108._4_4_ <= auVar30._4_4_;
              bVar13 = (fVar5 < *(float *)(uVar22 + 0xf8) && *(float *)(uVar22 + 0xe8) <= fVar5) &&
                       local_1108._8_4_ <= auVar30._8_4_;
              bVar14 = (fVar5 < *(float *)(uVar22 + 0xfc) && *(float *)(uVar22 + 0xec) <= fVar5) &&
                       local_1108._12_4_ <= auVar30._12_4_;
            }
            else {
              bVar11 = local_1108._0_4_ <= auVar30._0_4_;
              bVar12 = local_1108._4_4_ <= auVar30._4_4_;
              bVar13 = local_1108._8_4_ <= auVar30._8_4_;
              bVar14 = local_1108._12_4_ <= auVar30._12_4_;
            }
            auVar55._0_4_ = (uint)bVar11 * -0x80000000;
            auVar55._4_4_ = (uint)bVar12 * -0x80000000;
            auVar55._8_4_ = (uint)bVar13 * -0x80000000;
            auVar55._12_4_ = (uint)bVar14 * -0x80000000;
            uVar23 = movmskps((int)in_R8,auVar55);
          }
          in_R8 = (void *)CONCAT44((int)((ulong)in_R8 >> 0x20),uVar23);
          if (in_R8 == (void *)0x0) goto LAB_00d8b84c;
          lVar10 = 0;
          if (in_R8 != (void *)0x0) {
            for (; ((ulong)in_R8 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
            }
          }
          pvVar21 = *(void **)(uVar22 + lVar10 * 8);
          uVar23 = uVar23 - 1 & uVar23;
          if (uVar23 != 0) {
            uVar7 = *(uint *)(local_1108 + lVar10 * 4);
            lVar10 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
              }
            }
            pvVar9 = *(void **)(uVar22 + lVar10 * 8);
            uVar8 = *(uint *)(local_1108 + lVar10 * 4);
            uVar23 = uVar23 - 1 & uVar23;
            if (uVar23 == 0) {
              in_R8 = pvVar9;
              if (uVar7 < uVar8) {
                *(void **)*pauVar20 = pvVar9;
                *(uint *)((long)*pauVar20 + 8) = uVar8;
                pauVar20 = pauVar20 + 1;
              }
              else {
                *(void **)*pauVar20 = pvVar21;
                *(uint *)((long)*pauVar20 + 8) = uVar7;
                pauVar20 = pauVar20 + 1;
                pvVar21 = pvVar9;
              }
            }
            else {
              auVar58._8_4_ = uVar7;
              auVar58._0_8_ = pvVar21;
              auVar58._12_4_ = 0;
              auVar75._8_4_ = uVar8;
              auVar75._0_8_ = pvVar9;
              auVar75._12_4_ = 0;
              lVar10 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                }
              }
              in_R8 = *(void **)(uVar22 + lVar10 * 8);
              iVar27 = *(int *)(local_1108 + lVar10 * 4);
              auVar66._8_4_ = iVar27;
              auVar66._0_8_ = in_R8;
              auVar66._12_4_ = 0;
              auVar40._8_4_ = -(uint)((int)uVar7 < (int)uVar8);
              uVar23 = uVar23 - 1 & uVar23;
              if (uVar23 == 0) {
                auVar40._4_4_ = auVar40._8_4_;
                auVar40._0_4_ = auVar40._8_4_;
                auVar40._12_4_ = auVar40._8_4_;
                auVar83._8_4_ = uVar8;
                auVar83._0_8_ = pvVar9;
                auVar83._12_4_ = 0;
                auVar61 = blendvps(auVar83,auVar58,auVar40);
                auVar30 = blendvps(auVar58,auVar75,auVar40);
                auVar41._8_4_ = -(uint)(auVar61._8_4_ < iVar27);
                auVar41._4_4_ = auVar41._8_4_;
                auVar41._0_4_ = auVar41._8_4_;
                auVar41._12_4_ = auVar41._8_4_;
                auVar76._8_4_ = iVar27;
                auVar76._0_8_ = in_R8;
                auVar76._12_4_ = 0;
                auVar31 = blendvps(auVar76,auVar61,auVar41);
                auVar100 = blendvps(auVar61,auVar66,auVar41);
                auVar42._8_4_ = -(uint)(auVar30._8_4_ < auVar100._8_4_);
                auVar42._4_4_ = auVar42._8_4_;
                auVar42._0_4_ = auVar42._8_4_;
                auVar42._12_4_ = auVar42._8_4_;
                auVar61 = blendvps(auVar100,auVar30,auVar42);
                auVar30 = blendvps(auVar30,auVar100,auVar42);
                *pauVar20 = auVar30;
                pauVar20[1] = auVar61;
                pvVar21 = auVar31._0_8_;
                pauVar20 = pauVar20 + 2;
              }
              else {
                lVar10 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                  }
                }
                auVar43._4_4_ = auVar40._8_4_;
                auVar43._0_4_ = auVar40._8_4_;
                auVar43._8_4_ = auVar40._8_4_;
                auVar43._12_4_ = auVar40._8_4_;
                auVar100 = blendvps(auVar75,auVar58,auVar43);
                auVar30 = blendvps(auVar58,auVar75,auVar43);
                auVar89._8_4_ = *(int *)(local_1108 + lVar10 * 4);
                auVar89._0_8_ = *(undefined8 *)(uVar22 + lVar10 * 8);
                auVar89._12_4_ = 0;
                auVar44._8_4_ = -(uint)(iVar27 < *(int *)(local_1108 + lVar10 * 4));
                auVar44._4_4_ = auVar44._8_4_;
                auVar44._0_4_ = auVar44._8_4_;
                auVar44._12_4_ = auVar44._8_4_;
                auVar31 = blendvps(auVar89,auVar66,auVar44);
                auVar61 = blendvps(auVar66,auVar89,auVar44);
                auVar45._8_4_ = -(uint)(auVar30._8_4_ < auVar61._8_4_);
                auVar45._4_4_ = auVar45._8_4_;
                auVar45._0_4_ = auVar45._8_4_;
                auVar45._12_4_ = auVar45._8_4_;
                auVar90 = blendvps(auVar61,auVar30,auVar45);
                auVar30 = blendvps(auVar30,auVar61,auVar45);
                auVar46._8_4_ = -(uint)(auVar100._8_4_ < auVar31._8_4_);
                auVar46._4_4_ = auVar46._8_4_;
                auVar46._0_4_ = auVar46._8_4_;
                auVar46._12_4_ = auVar46._8_4_;
                auVar61 = blendvps(auVar31,auVar100,auVar46);
                auVar100 = blendvps(auVar100,auVar31,auVar46);
                auVar47._8_4_ = -(uint)(auVar100._8_4_ < auVar90._8_4_);
                auVar47._4_4_ = auVar47._8_4_;
                auVar47._0_4_ = auVar47._8_4_;
                auVar47._12_4_ = auVar47._8_4_;
                auVar31 = blendvps(auVar90,auVar100,auVar47);
                auVar100 = blendvps(auVar100,auVar90,auVar47);
                *pauVar20 = auVar30;
                pauVar20[1] = auVar100;
                pauVar20[2] = auVar31;
                pvVar21 = auVar61._0_8_;
                pauVar20 = pauVar20 + 3;
              }
            }
          }
        }
        in_R8 = local_10c8->leafIntersector;
        (**(code **)((long)in_R8 + (ulong)*(byte *)((ulong)pvVar21 & 0xfffffffffffffff0) * 0x40))
                  (local_fb8,ray,local_10c0);
        fVar91 = (local_10d0->super_RayK<1>).tfar;
        ray = local_10d0;
        fVar52 = fVar91;
        fVar53 = fVar91;
        fVar54 = fVar91;
        auVar98 = local_1078;
        fVar84 = local_10a8;
        fVar28 = fStack_10a4;
        fVar92 = fStack_10a0;
        fVar106 = fStack_109c;
        fVar29 = local_1098;
        fVar77 = fStack_1094;
        fVar50 = fStack_1090;
        fVar107 = fStack_108c;
        fVar49 = local_10f8;
        fVar78 = fStack_10f4;
        fVar51 = fStack_10f0;
        fVar59 = fStack_10ec;
        fVar48 = local_10e8;
        fVar60 = fStack_10e4;
        fVar67 = fStack_10e0;
        fVar68 = fStack_10dc;
        fVar103 = local_1088;
        fVar69 = fStack_1084;
        fVar70 = fStack_1080;
        fVar71 = fStack_107c;
        fVar101 = local_10b8;
        fVar93 = fStack_10b4;
        fVar94 = fStack_10b0;
        fVar96 = fStack_10ac;
      }
LAB_00d8b84c:
    } while (pauVar20 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }